

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O0

bool duckdb::TrySimpleIntegerCast<short,_true>(char *buf,idx_t len,short *result,bool strict)

{
  bool bVar1;
  undefined2 *in_RDX;
  IntegerDecimalCastData<short> cast_data;
  IntegerCastData<short> simple_data;
  IntegerDecimalCastData<short> *in_stack_ffffffffffffffb8;
  idx_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined2 local_24;
  undefined1 local_1;
  
  bVar1 = TryIntegerCast<duckdb::IntegerCastData<short>,_true,_false,_duckdb::IntegerCastOperation,_true,____>
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     (IntegerCastData<short> *)in_stack_ffffffffffffffb8,false);
  if (bVar1) {
    *in_RDX = local_24;
    local_1 = true;
  }
  else {
    bVar1 = TryIntegerCast<duckdb::IntegerDecimalCastData<short>,_true,_true,_duckdb::IntegerDecimalCastOperation,_true,____>
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                       ,false);
    if (bVar1) {
      *in_RDX = (short)in_stack_ffffffffffffffc0;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static inline bool TrySimpleIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	IntegerCastData<T> simple_data;
	if (TryIntegerCast<IntegerCastData<T>, IS_SIGNED, false, IntegerCastOperation>(buf, len, simple_data, strict)) {
		result = (T)simple_data.result;
		return true;
	}

	// Simple integer cast failed, try again with decimals/exponents included
	// FIXME: This could definitely be improved as some extra work is being done here. It is more important that
	//  "normal" integers (without exponent/decimals) are still being parsed quickly.
	IntegerDecimalCastData<T> cast_data;
	if (TryIntegerCast<IntegerDecimalCastData<T>, IS_SIGNED, true, IntegerDecimalCastOperation>(buf, len, cast_data,
	                                                                                            strict)) {
		result = (T)cast_data.result;
		return true;
	}
	return false;
}